

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

void cs_impl::list_cs_ext::sort(list *lst,var *func)

{
  size_t *psVar1;
  list<cs_impl::any,std::allocator<cs_impl::any>> *this;
  _List_node_base *p_Var2;
  anon_class_8_1_898bcfc2 __comp;
  long lVar3;
  _List_node_base *this_00;
  long lVar4;
  list<cs_impl::any,std::allocator<cs_impl::any>> *__x;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  bool bVar7;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> __carry;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> __tmp [64];
  _List_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_658;
  anon_class_8_1_898bcfc2 local_640;
  _List_base<cs_impl::any,_std::allocator<cs_impl::any>_> local_638 [64];
  
  local_658._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_658;
  local_658._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_658;
  p_Var5 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if ((p_Var5 != (_List_node_base *)lst) &&
     ((((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)&p_Var5->_M_next)->_M_impl).
      _M_node.super__List_node_base._M_next != (_List_node_base *)lst)) {
    local_658._M_impl._M_node._M_size = 0;
    lVar3 = 0;
    do {
      lVar4 = (long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar3;
      *(long *)((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_prev + lVar3) = lVar4;
      *(long *)lVar4 = lVar4;
      *(undefined8 *)((long)&local_638[0]._M_impl._M_node._M_size + lVar3) = 0;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x600);
    p_Var5 = (_List_node_base *)local_638;
    local_640.func = func;
    do {
      p_Var6 = p_Var5;
      p_Var5 = (_List_node_base *)local_638;
      p_Var2 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      if (p_Var2->_M_next != local_658._M_impl._M_node.super__List_node_base._M_next &&
          local_658._M_impl._M_node.super__List_node_base._M_next != p_Var2) {
        std::__detail::_List_node_base::_M_transfer
                  (local_658._M_impl._M_node.super__List_node_base._M_next,p_Var2);
        local_658._M_impl._M_node._M_size =
             (long)(_List_node_base **)local_658._M_impl._M_node._M_size + 1;
        psVar1 = &(lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 - 1;
      }
      __comp.func = local_640.func;
      bVar7 = p_Var5 == p_Var6;
      if (bVar7) {
        lVar3 = 0x18;
      }
      else if (local_638[0]._M_impl._M_node.super__List_node_base._M_next == p_Var5) {
        lVar3 = 0;
      }
      else {
        do {
          this_00 = p_Var5;
          std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
          merge<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
                    ((list<cs_impl::any,std::allocator<cs_impl::any>> *)this_00,
                     (list<cs_impl::any,_std::allocator<cs_impl::any>_> *)&local_658,__comp);
          std::__detail::_List_node_base::swap((_List_node_base *)&local_658,this_00);
          p_Var2 = this_00[1]._M_next;
          this_00[1]._M_next = (_List_node_base *)local_658._M_impl._M_node._M_size;
          p_Var5 = (_List_node_base *)&this_00[1]._M_prev;
          bVar7 = p_Var5 == p_Var6;
          if (bVar7) {
            lVar3 = 0x18;
            goto LAB_0019012c;
          }
          local_658._M_impl._M_node._M_size = (size_t)p_Var2;
        } while (*(_List_node_base **)p_Var5 != p_Var5);
        lVar3 = 0;
LAB_0019012c:
        p_Var5 = (_List_node_base *)&this_00[1]._M_prev;
        local_658._M_impl._M_node._M_size = (size_t)p_Var2;
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&local_658,p_Var5);
      p_Var2 = p_Var5[1]._M_next;
      p_Var5[1]._M_next = (_List_node_base *)local_658._M_impl._M_node._M_size;
      p_Var5 = (_List_node_base *)((long)&p_Var6->_M_next + lVar3);
      local_658._M_impl._M_node._M_size = (size_t)p_Var2;
    } while ((lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
             super__List_node_base._M_next != (_List_node_base *)lst);
    __x = (list<cs_impl::any,std::allocator<cs_impl::any>> *)local_638;
    while (this = __x + 0x18, (_List_node_base *)this != p_Var5) {
      std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
      merge<cs_impl::list_cs_ext::sort(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)::__0>
                (this,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)__x,local_640);
      __x = this;
    }
    p_Var5 = p_Var6 + 1;
    if (!bVar7) {
      p_Var5 = (_List_node_base *)&p_Var6[-1]._M_prev;
      p_Var6 = (_List_node_base *)&p_Var6[-2]._M_prev;
    }
    std::__detail::_List_node_base::swap((_List_node_base *)lst,p_Var6);
    p_Var2 = p_Var5->_M_next;
    p_Var5->_M_next =
         (_List_node_base *)
         (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
         _M_size;
    (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node._M_size =
         (size_t)p_Var2;
    lVar3 = 0x5e8;
    do {
      std::__cxx11::_List_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_clear
                ((_List_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                 ((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    std::__cxx11::_List_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_clear(&local_658);
  }
  return;
}

Assistant:

char get(istream &in)
		{
			return in->get();
		}